

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMReadWriteGraphBuilder.h
# Opt level: O3

ReadWriteGraph * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::build(LLVMReadWriteGraphBuilder *this)

{
  long lVar1;
  DGCallGraphImpl *this_00;
  iterator iVar2;
  RWSubgraph *pRVar3;
  StringRef SVar4;
  CallGraph CG;
  _Head_base<0UL,_dg::llvmdg::CallGraphImpl_*,_false> local_20;
  
  if (*(int *)(this->PTA + 0x70) == 3) {
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildGlobals
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>);
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildAllFuns
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>);
  }
  else {
    lVar1 = *(long *)(*(long *)(this->PTA + 0x80) + 0x38);
    this_00 = (DGCallGraphImpl *)operator_new(0x40);
    llvmdg::DGCallGraphImpl::DGCallGraphImpl
              (this_00,(GenericCallGraph<dg::pta::PSNode_*> *)(lVar1 + 0x48));
    local_20._M_head_impl = (CallGraphImpl *)this_00;
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildGlobals
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>);
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildFunsFromCG
              (&this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>,
               (CallGraph *)&local_20);
    if ((DGCallGraphImpl *)local_20._M_head_impl != (DGCallGraphImpl *)0x0) {
      (*((CallGraphImpl *)&(local_20._M_head_impl)->_vptr_CallGraphImpl)->_vptr_CallGraphImpl[1])();
    }
  }
  SVar4.Length = *(size_t *)this->_options;
  SVar4.Data = (char *)(this->
                       super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>).
                       _module;
  local_20._M_head_impl = (CallGraphImpl *)llvm::Module::getFunction(SVar4);
  iVar2 = std::
          _Hashtable<const_llvm::Function_*,_std::pair<const_llvm::Function_*const,_dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::SubgraphInfo>,_std::allocator<std::pair<const_llvm::Function_*const,_dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::SubgraphInfo>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Function_*>,_std::hash<const_llvm::Function_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->super_GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>
                  )._subgraphs._M_h,(key_type *)&local_20);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_llvm::Function_*const,_dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::SubgraphInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    pRVar3 = (RWSubgraph *)0x0;
  }
  else {
    pRVar3 = *(RWSubgraph **)
              ((long)iVar2.
                     super__Node_iterator_base<std::pair<const_llvm::Function_*const,_dg::GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::SubgraphInfo>,_false>
                     ._M_cur + 0x10);
  }
  (this->graph)._entry = pRVar3;
  return &this->graph;
}

Assistant:

ReadWriteGraph &&build() {
        // FIXME: this is a bit of a hack
        if (!PTA->getOptions().isSVF()) {
            auto *dgpta = static_cast<DGLLVMPointerAnalysis *>(PTA);
            llvmdg::CallGraph CG(dgpta->getPTA()->getPG()->getCallGraph());
            buildFromLLVM(&CG);
        } else {
            buildFromLLVM();
        }

        auto *entry = getModule()->getFunction(_options.entryFunction);
        assert(entry && "Did not find the entry function");
        graph.setEntry(getSubgraph(entry));

        return std::move(graph);
    }